

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_d25b::VectorMerge<sptk::uint24_t>::Run
          (VectorMerge<sptk::uint24_t> *this,istream *input_stream,istream *insert_stream,
          bool *eof_reached)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> garbage;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> merged_vector;
  allocator_type local_69;
  bool *local_68;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> local_60;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> local_48;
  
  if ((this->recursive_ != true) || (bVar2 = true, this->has_vector_ == true)) {
    local_68 = eof_reached;
    std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
              (&local_48,(long)this->merged_length_,(allocator_type *)&local_60);
    std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
              (&local_60,(long)this->input_skip_length_,&local_69);
    do {
      if ((0 < this->insert_point_) &&
         (bVar2 = sptk::ReadStream<sptk::uint24_t>
                            (false,0,0,this->insert_point_,&local_48,input_stream,(int *)0x0),
         !bVar2)) {
LAB_0010728c:
        bVar2 = true;
        if (local_68 != (bool *)0x0) {
          iVar3 = std::istream::peek();
          if (iVar3 == -1) {
            iVar3 = std::istream::peek();
            bVar6 = iVar3 == -1;
          }
          else {
            bVar6 = false;
          }
          *local_68 = bVar6;
        }
        goto LAB_001072bc;
      }
      if (this->recursive_ == true) {
        puVar1 = (this->insert_vector_).
                 super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (long)(this->insert_vector_).
                      super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1;
        if (0 < (long)uVar4) {
          iVar3 = this->insert_point_;
          uVar4 = uVar4 / 3 + 1;
          lVar5 = 0;
          do {
            local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3].value[lVar5] = puVar1->value[lVar5];
            local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3].value[lVar5 + 1] = puVar1->value[lVar5 + 1];
            local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3].value[lVar5 + 2] = puVar1->value[lVar5 + 2];
            uVar4 = uVar4 - 1;
            lVar5 = lVar5 + 3;
          } while (1 < uVar4);
        }
      }
      else {
        bVar2 = sptk::ReadStream<sptk::uint24_t>
                          (false,0,this->insert_point_,this->insert_length_,&local_48,insert_stream,
                           (int *)0x0);
        if (!bVar2) goto LAB_0010728c;
      }
      iVar3 = this->input_skip_length_;
      if (this->input_rest_length_ < 1) {
        if (0 < iVar3) {
          bVar2 = sptk::ReadStream<sptk::uint24_t>
                            (false,0,0,iVar3,&local_60,input_stream,(int *)0x0);
          goto LAB_00107267;
        }
      }
      else {
        bVar2 = sptk::ReadStream<sptk::uint24_t>
                          (false,iVar3,this->insert_length_ + this->insert_point_,
                           this->input_rest_length_,&local_48,input_stream,(int *)0x0);
LAB_00107267:
        if (bVar2 == false) goto LAB_0010728c;
      }
      bVar2 = sptk::WriteStream<sptk::uint24_t>
                        (0,this->merged_length_,&local_48,(ostream *)&std::cout,(int *)0x0);
    } while (bVar2);
    bVar2 = false;
LAB_001072bc:
    if (local_60.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar2;
}

Assistant:

bool Run(std::istream* input_stream, std::istream* insert_stream,
           bool* eof_reached) const override {
    if (recursive_ && !has_vector_) {
      return true;
    }

    std::vector<T> merged_vector(merged_length_);
    std::vector<T> garbage(input_skip_length_);
    for (;;) {
      if (0 < insert_point_) {
        if (!sptk::ReadStream(false, 0, 0, insert_point_, &merged_vector,
                              input_stream, NULL)) {
          break;
        }
      }
      if (recursive_) {
        std::copy(insert_vector_.begin(), insert_vector_.end(),
                  merged_vector.begin() + insert_point_);
      } else if (!sptk::ReadStream(false, 0, insert_point_, insert_length_,
                                   &merged_vector, insert_stream, NULL)) {
        break;
      }
      if (0 < input_rest_length_) {
        if (!sptk::ReadStream(
                false, input_skip_length_, insert_point_ + insert_length_,
                input_rest_length_, &merged_vector, input_stream, NULL)) {
          break;
        }
      } else if (0 < input_skip_length_) {
        if (!sptk::ReadStream(false, 0, 0, input_skip_length_, &garbage,
                              input_stream, NULL)) {
          break;
        }
      }
      if (!sptk::WriteStream(0, merged_length_, merged_vector, &std::cout,
                             NULL)) {
        return false;
      }
    }

    if (NULL != eof_reached) {
      *eof_reached =
          (input_stream->peek() == std::istream::traits_type::eof() &&
           insert_stream->peek() == std::istream::traits_type::eof());
    }
    return true;
  }